

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeArrayView *src,float *texCoord,ReferenceParams *params
               )

{
  Vec3 *s;
  Vec3 *s_00;
  Vec3 *w;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  int y;
  Vec3 *s_01;
  int px;
  int iVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined4 in_XMM6_Db;
  undefined4 in_XMM6_Dc;
  undefined4 in_XMM6_Dd;
  TextureCubeArrayView TVar20;
  Vec3 triQ [2];
  TextureCubeArrayView src_1;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  float local_1a4;
  Vec3 local_178;
  float local_16c;
  float local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined1 local_158 [16];
  float local_148 [8];
  Sampler *local_128;
  undefined1 local_120 [16];
  Vec3 local_110;
  undefined1 local_104 [12];
  undefined1 local_f8 [16];
  Vec3 local_e8;
  float local_dc;
  float local_d8;
  float local_d4;
  Vec3 local_c8;
  float local_bc;
  float local_b8;
  float local_b4;
  Vec3 local_a8;
  float local_9c;
  float local_98;
  float local_94;
  Vec4 *local_90;
  Vec3 local_88;
  float fStack_7c;
  undefined8 local_78;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_68;
  tcu local_50 [16];
  tcu local_40 [16];
  
  fVar12 = *texCoord;
  fVar13 = texCoord[1];
  fVar14 = texCoord[4];
  fVar17 = texCoord[8];
  fVar15 = texCoord[0xc];
  fVar19 = texCoord[5];
  fVar18 = texCoord[9];
  fVar1 = texCoord[0xd];
  fVar2 = texCoord[2];
  fVar16 = texCoord[6];
  fVar3 = texCoord[10];
  fVar4 = texCoord[0xe];
  fVar5 = texCoord[3];
  local_168 = texCoord[7];
  local_158._0_4_ = texCoord[0xb];
  fVar6 = texCoord[0xf];
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = &params->sampler;
  TVar20 = tcu::getEffectiveTextureView
                     (src,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)&local_68,local_128);
  local_120._8_8_ = TVar20.m_levels;
  local_120._0_4_ = TVar20.m_numLevels;
  iVar8 = dst->m_width;
  iVar10 = dst->m_height;
  local_a8.m_data[0] = fVar12;
  local_a8.m_data[1] = fVar14;
  local_a8.m_data[2] = fVar17;
  local_9c = fVar15;
  local_98 = fVar17;
  local_94 = fVar14;
  local_c8.m_data[0] = fVar13;
  local_c8.m_data[1] = fVar19;
  local_c8.m_data[2] = fVar18;
  local_bc = fVar1;
  local_b8 = fVar18;
  local_b4 = fVar19;
  local_e8.m_data[0] = fVar2;
  local_e8.m_data[1] = fVar16;
  local_e8.m_data[2] = fVar3;
  local_dc = fVar4;
  local_d8 = fVar3;
  local_d4 = fVar16;
  local_148[0] = fVar5;
  local_148[1] = local_168;
  local_148[2] = (float)local_158._0_4_;
  local_148[3] = fVar6;
  local_148[4] = (float)local_158._0_4_;
  local_148[5] = local_168;
  local_88.m_data[0] = (params->super_RenderParams).w.m_data[0];
  local_88.m_data[1] = (params->super_RenderParams).w.m_data[1];
  local_88.m_data[2] = (params->super_RenderParams).w.m_data[2];
  fStack_7c = (params->super_RenderParams).w.m_data[3];
  local_78 = CONCAT44(local_88.m_data[1],local_88.m_data[2]);
  local_1a4 = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_1a4 = (params->super_RenderParams).bias;
  }
  fVar12 = (float)iVar8;
  fVar13 = (float)iVar10;
  local_90 = &(params->super_RenderParams).colorBias;
  for (y = 0; y < iVar10; y = y + 1) {
    fVar14 = (float)y + 0.5;
    fVar17 = fVar14 / fVar13;
    local_16c = 1.0 - fVar17;
    for (iVar10 = 0; iVar10 < iVar8; iVar10 = iVar10 + 1) {
      fVar19 = (float)iVar10 + 0.5;
      local_168 = fVar19 / fVar12;
      bVar7 = 1.0 <= fVar17 + local_168;
      fVar15 = fVar17;
      uStack_164 = in_XMM6_Db;
      uStack_160 = in_XMM6_Dc;
      uStack_15c = in_XMM6_Dd;
      if (bVar7) {
        local_168 = 1.0 - local_168;
        fVar15 = local_16c;
        uStack_164 = 0;
        uStack_160 = 0;
        uStack_15c = 0;
      }
      uVar9 = (ulong)bVar7;
      s_01 = &local_a8 + uVar9;
      s = &local_c8 + uVar9;
      s_00 = &local_e8 + uVar9;
      fVar18 = s_00->m_data[0];
      local_178.m_data[2] =
           ((&local_e8)[uVar9].m_data[1] - fVar18) * fVar15 +
           ((&local_e8)[uVar9].m_data[2] - fVar18) * local_168 + fVar18;
      fVar18 = s->m_data[0];
      fVar1 = s_01->m_data[0];
      local_158 = ZEXT416((uint)fVar15);
      local_178.m_data[1] =
           fVar15 * ((&local_c8)[uVar9].m_data[1] - fVar18) +
           local_168 * ((&local_c8)[uVar9].m_data[2] - fVar18) + fVar18;
      local_178.m_data[0] =
           fVar15 * ((&local_a8)[uVar9].m_data[1] - fVar1) +
           local_168 * ((&local_a8)[uVar9].m_data[2] - fVar1) + fVar1;
      fVar18 = local_148[uVar9 * 3];
      fVar1 = local_148[uVar9 * 3 + 1];
      fVar2 = local_148[uVar9 * 3 + 2];
      w = &local_88 + uVar9;
      fVar15 = triDerivateX(s_01,w,fVar19,fVar12,fVar15);
      fVar16 = triDerivateX(s,w,fVar19,fVar12,(float)local_158._0_4_);
      local_104._8_4_ = triDerivateX(s_00,w,fVar19,fVar12,(float)local_158._0_4_);
      local_104._0_4_ = fVar15;
      local_104._4_4_ = fVar16;
      fVar15 = triDerivateY(s_01,w,fVar14,fVar13,local_168);
      fVar19 = triDerivateY(s,w,fVar14,fVar13,local_168);
      local_110.m_data[2] = triDerivateY(s_00,w,fVar14,fVar13,local_168);
      if ((int)local_120._0_4_ < 1) {
        iVar8 = 0;
      }
      else {
        iVar8 = ((IVec3 *)(local_120._8_8_ + 8))->m_data[0];
      }
      local_110.m_data[0] = fVar15;
      local_110.m_data[1] = fVar19;
      fVar19 = computeCubeLodFromDerivates
                         (params->lodMode,&local_178,(Vec3 *)local_104,&local_110,iVar8);
      fVar18 = (fVar1 - fVar18) * (float)local_158._0_4_ + (fVar2 - fVar18) * local_168 + fVar18;
      fVar19 = fVar19 + local_1a4;
      fVar15 = params->maxLod;
      if (fVar19 <= params->maxLod) {
        fVar15 = fVar19;
      }
      uVar11 = -(uint)(fVar19 < params->minLod);
      fVar15 = (float)(uVar11 & (uint)params->minLod | ~uVar11 & (uint)fVar15);
      if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
        local_f8._0_4_ =
             tcu::TextureCubeArrayView::sampleCompare
                       ((TextureCubeArrayView *)local_120,local_128,(params->super_RenderParams).ref
                        ,local_178.m_data[0],local_178.m_data[1],local_178.m_data[2],fVar18,fVar15);
        local_f8._4_8_ = 0;
        local_f8._12_4_ = 1.0;
      }
      else {
        tcu::TextureCubeArrayView::sample
                  ((TextureCubeArrayView *)local_f8,(Sampler *)local_120,local_178.m_data[0],
                   local_178.m_data[1],local_178.m_data[2],fVar18,fVar15);
      }
      tcu::operator*(local_50,(Vector<float,_4> *)local_f8,&(params->super_RenderParams).colorScale)
      ;
      tcu::operator+(local_40,(Vector<float,_4> *)local_50,local_90);
      tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_40,iVar10,y);
      iVar8 = dst->m_width;
    }
    iVar10 = dst->m_height;
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_68);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	tcu::Vec4 rq = tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	tcu::Vec4 qq = tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	sampleTextureCubeArray(dst, src, sq, tq, rq, qq, params);
}